

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressorSimd.h
# Opt level: O0

void __thiscall Imf_2_5::SimdAlignedBuffer64<float>::alloc(SimdAlignedBuffer64<float> *this)

{
  void *pvVar1;
  ulong uVar2;
  ulong *in_RDI;
  char *aligned;
  size_t in_stack_fffffffffffffff0;
  
  pvVar1 = EXRAllocAligned(in_stack_fffffffffffffff0,(size_t)in_RDI);
  in_RDI[1] = (ulong)pvVar1;
  if ((in_RDI[1] & 0x1f) == 0) {
    *in_RDI = in_RDI[1];
  }
  else {
    EXRFreeAligned((void *)0x18f614);
    pvVar1 = EXRAllocAligned(in_stack_fffffffffffffff0,(size_t)in_RDI);
    in_RDI[1] = (ulong)pvVar1;
    for (uVar2 = in_RDI[1]; (uVar2 & 0x1f) != 0; uVar2 = uVar2 + 1) {
    }
    *in_RDI = uVar2;
  }
  return;
}

Assistant:

void alloc()
        {
            //
            // Try EXRAllocAligned first - but it might fallback to
            // unaligned allocs. If so, overalloc.
            //

            _handle = (char *) EXRAllocAligned
                (64 * sizeof(T), _SSE_ALIGNMENT);

            if (((size_t)_handle & (_SSE_ALIGNMENT - 1)) == 0)
            {
                _buffer = (T *)_handle;
                return;
            }

            EXRFreeAligned(_handle);
            _handle = (char *) EXRAllocAligned
                (64 * sizeof(T) + _SSE_ALIGNMENT, _SSE_ALIGNMENT);

            char *aligned = _handle;

            while ((size_t)aligned & (_SSE_ALIGNMENT - 1))
                aligned++;

            _buffer = (T *)aligned;    
        }